

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void jit_secure_call(lua_State *L,TValue *base,int nres)

{
  undefined4 *puVar1;
  ulong uVar2;
  GCstr *pGVar3;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  global_State *g;
  undefined4 in_stack_ffffffffffffff80;
  
  uVar2 = (ulong)*(uint *)(in_RDI + 8);
  if (*(int *)(uVar2 + 400) != 0) {
    puVar1 = *(undefined4 **)(in_RDI + 0x18);
    *(undefined4 **)(in_RDI + 0x18) = puVar1 + 2;
    pGVar3 = lj_err_str((lua_State *)CONCAT44(in_EDX,in_stack_ffffffffffffff80),LJ_ERR_ERRMEM);
    *puVar1 = (int)pGVar3;
    puVar1[1] = 0xfffffffb;
    if (*(long *)(uVar2 + 0x178) != 0) {
      (**(code **)(uVar2 + 0x178))(in_RDI);
    }
    exit(1);
  }
  *(uint *)(uVar2 + 0x31c) = *(uint *)(uVar2 + 0x31c) & 0xffffffef;
  lj_vm_call(in_RDI,in_RSI,in_EDX);
  return;
}

Assistant:

static void jit_secure_call(lua_State *L, TValue *base, int nres) {
  global_State *g = G(L);
  /* Forbid Lua world re-entrancy while running the trace */
  if (tvref(g->jit_base)) {
    setstrV(L, L->top++, lj_err_str(L, LJ_ERR_JITCALL));
    if (g->panic) g->panic(L);
    exit(EXIT_FAILURE);
  }
  lj_trace_abort(g);  /* Never record across Lua VM entrance */
  lj_vm_call(L, base, nres);
}